

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O3

void __thiscall btSparseSdf<3>::BuildCell(btSparseSdf<3> *this,Cell *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  int iVar9;
  sResults *in_R8;
  Cell *pCVar10;
  btScalar bVar11;
  btTransform unit;
  sResults res;
  float local_d8;
  float local_d4;
  float local_d0;
  undefined4 local_cc;
  long local_c8;
  Cell *local_c0;
  long local_b8;
  Cell *local_b0;
  btConvexShape local_a8;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  
  iVar4 = c->c[0];
  iVar5 = c->c[1];
  iVar6 = c->c[2];
  fVar1 = this->voxelsz;
  local_c8 = 0;
  pCVar10 = c;
  do {
    iVar9 = (int)local_c8;
    fVar2 = this->voxelsz;
    local_b8 = 0;
    local_c0 = pCVar10;
    do {
      iVar7 = (int)local_b8;
      fVar3 = this->voxelsz;
      lVar8 = 0;
      local_b0 = pCVar10;
      do {
        local_d8 = (float)(int)lVar8 * this->voxelsz + (float)iVar4 * 3.0 * fVar1;
        local_cc = 0;
        local_a8.super_btCollisionShape._vptr_btCollisionShape._0_4_ = 0x3f800000;
        local_a8.super_btCollisionShape._4_8_ = 0;
        local_a8.super_btCollisionShape._12_8_ = 0;
        local_a8.super_btCollisionShape.m_userPointer._4_4_ = 0x3f800000;
        local_a8.super_btCollisionShape.m_userIndex = 0;
        local_a8.super_btCollisionShape._28_4_ = 0;
        uStack_88 = 0;
        local_80 = 0x3f800000;
        local_6c = 0;
        local_7c = 0;
        uStack_74 = 0;
        bVar11 = 0.0;
        if (c->pclient->m_shapeType < 0x14) {
          local_d4 = (float)iVar7 * fVar3 + (float)iVar5 * 3.0 * fVar1;
          local_d0 = (float)iVar9 * fVar2 + (float)iVar6 * 3.0 * fVar1;
          bVar11 = btGjkEpaSolver2::SignedDistance
                             ((btGjkEpaSolver2 *)&local_d8,(btVector3 *)c->pclient,0.0,&local_a8,
                              (btTransform *)&stack0xffffffffffffff98,in_R8);
        }
        pCVar10->d[0][0][0] = bVar11;
        lVar8 = lVar8 + 1;
        pCVar10 = (Cell *)(pCVar10->d + 1);
      } while (lVar8 != 4);
      local_b8 = local_b8 + 1;
      pCVar10 = (Cell *)(local_b0->d[0] + 1);
    } while (local_b8 != 4);
    local_c8 = local_c8 + 1;
    pCVar10 = (Cell *)(local_c0->d[0][0] + 1);
  } while (local_c8 != 4);
  return;
}

Assistant:

void					BuildCell(Cell& c)
	{
		const btVector3	org=btVector3(	(btScalar)c.c[0],
			(btScalar)c.c[1],
			(btScalar)c.c[2])	*
			CELLSIZE*voxelsz;
		for(int k=0;k<=CELLSIZE;++k)
		{
			const btScalar	z=voxelsz*k+org.z();
			for(int j=0;j<=CELLSIZE;++j)
			{
				const btScalar	y=voxelsz*j+org.y();
				for(int i=0;i<=CELLSIZE;++i)
				{
					const btScalar	x=voxelsz*i+org.x();
					c.d[i][j][k]=DistanceToShape(	btVector3(x,y,z),
						c.pclient);
				}
			}
		}
	}